

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O0

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapeQuad>::ComputeSolutionKernelHdivT<std::complex<double>>
          (TPZCompElKernelHDiv3D<pzshape::TPZShapeQuad> *this,
          TPZMaterialDataT<std::complex<double>_> *data)

{
  int iVar1;
  undefined4 uVar2;
  long *plVar3;
  TPZCompMesh *this_00;
  TPZFMatrix<std::complex<double>_> *this_01;
  int64_t from;
  TPZManVector<std::complex<double>,_10> *pTVar4;
  TPZFNMatrix<30,_std::complex<double>_> *pTVar5;
  long in_RSI;
  long *in_RDI;
  int64_t is;
  int64_t numbersol;
  TPZFMatrix<std::complex<double>_> *MeshSol;
  int64_t in_stack_00000058;
  int ncon;
  int nstate;
  int dim;
  TPZSolVec<std::complex<double>_> *in_stack_00000080;
  TPZSolVec<std::complex<double>_> *in_stack_00000088;
  TPZFMatrix<double> *in_stack_00000090;
  TPZFMatrix<double> *in_stack_00000098;
  TPZCompElHCurl<pzshape::TPZShapeQuad> *in_stack_000000a0;
  TPZCompEl *in_stack_00000170;
  size_t in_stack_000003a8;
  char *in_stack_000003b0;
  TPZSolutionMatrix *in_stack_ffffffffffffff90;
  complex<double> local_58;
  complex<double> local_48;
  long index;
  undefined4 in_stack_ffffffffffffffe0;
  
  TPZCompElHCurl<pzshape::TPZShapeQuad>::ComputeSolutionHCurlT<std::complex<double>>
            (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088,
             in_stack_00000080);
  plVar3 = (long *)(**(code **)(*in_RDI + 0xb8))();
  iVar1 = (**(code **)(*plVar3 + 0x78))();
  uVar2 = (**(code **)(*in_RDI + 0x90))();
  this_00 = TPZCompEl::Mesh(in_stack_00000170);
  TPZCompMesh::Solution(this_00);
  this_01 = TPZSolutionMatrix::operator_cast_to_TPZFMatrix_(in_stack_ffffffffffffff90);
  from = TPZBaseMatrix::Cols((TPZBaseMatrix *)this_01);
  if (from != 1) {
    pzinternal::DebugStopImpl(in_stack_000003b0,in_stack_000003a8);
  }
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *)_nstate,in_stack_00000058);
  TPZManVector<TPZFNMatrix<30,_std::complex<double>_>,_20>::Resize(_nstate,in_stack_00000058);
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::Resize
            ((TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *)_nstate,in_stack_00000058);
  for (index = 0; index < from; index = index + 1) {
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                       ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(in_RSI + 0x48d0),index);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,(long)(iVar1 * 3));
    TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
              ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(in_RSI + 0x48d0),index);
    std::complex<double>::complex(&local_48,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              ((TPZVec<std::complex<double>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
               (complex<double> *)this_01,from,index);
    pTVar5 = TPZVec<TPZFNMatrix<30,_std::complex<double>_>_>::operator[]
                       ((TPZVec<TPZFNMatrix<30,_std::complex<double>_>_> *)(in_RSI + 0x57f0),index);
    (*(pTVar5->super_TPZFMatrix<std::complex<double>_>).super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])(pTVar5,(long)(iVar1 * 3),3);
    pTVar4 = TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
                       ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(in_RSI + 0x8a10),index);
    (*(pTVar4->super_TPZVec<std::complex<double>_>)._vptr_TPZVec[3])(pTVar4,(long)iVar1);
    TPZVec<TPZManVector<std::complex<double>,_10>_>::operator[]
              ((TPZVec<TPZManVector<std::complex<double>,_10>_> *)(in_RSI + 0x8a10),index);
    std::complex<double>::complex(&local_58,0.0,0.0);
    TPZVec<std::complex<double>_>::Fill
              ((TPZVec<std::complex<double>_> *)CONCAT44(uVar2,in_stack_ffffffffffffffe0),
               (complex<double> *)this_01,from,index);
  }
  TPZManVector<TPZManVector<std::complex<double>,_10>,_20>::operator=
            ((TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *)MeshSol,
             (TPZManVector<TPZManVector<std::complex<double>,_10>,_20> *)numbersol);
  return;
}

Assistant:

void TPZCompElKernelHDiv3D<TSHAPE>::ComputeSolutionKernelHdivT(TPZMaterialDataT<TVar> &data)
{
    this->ComputeSolutionHCurlT(data.phi, data.curlphi,
                                data.sol, data.curlsol);

    const int dim = 3; // Hdiv vectors are always in R3
    const int nstate = this->Material()->NStateVariables();
    const int ncon = this->NConnects();

    TPZFMatrix<TVar> &MeshSol = this->Mesh()->Solution();

    int64_t numbersol = MeshSol.Cols();

    if(numbersol != 1)
    {
        DebugStop();
    }
    data.sol.Resize(numbersol);
    data.dsol.Resize(numbersol);
    data.divsol.Resize(numbersol);

    for (int64_t is=0; is<numbersol; is++)
    {
        data.sol[is].Resize(dim*nstate);
        data.sol[is].Fill(0);
        data.dsol[is].Redim(dim*nstate, dim);
        data.divsol[is].Resize(nstate);
        data.divsol[is].Fill(0.);
    }
    data.sol = data.curlsol;

}